

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.h
# Opt level: O0

void __thiscall MeCab::FeatureIndex::FeatureIndex(FeatureIndex *this)

{
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffffa8;
  ChunkFreeList<char> *in_stack_ffffffffffffffb0;
  DictionaryRewriter *this_00;
  
  *in_RDI = &PTR___cxa_pure_virtual_002487f0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1dbd3f);
  ChunkFreeList<int>::ChunkFreeList
            ((ChunkFreeList<int> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ChunkFreeList<char>::ChunkFreeList(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (DictionaryRewriter *)(in_RDI + 0x12);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1dbd89);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1dbd9f);
  DictionaryRewriter::DictionaryRewriter(this_00);
  StringBuffer::StringBuffer((StringBuffer *)(in_RDI + 0x27));
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  return;
}

Assistant:

explicit FeatureIndex(): feature_freelist_(8192 * 32),
                           char_freelist_(8192 * 32),
                           maxid_(0), alpha_(0) {}